

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O0

Belief * __thiscall despot::Tag::InitialBelief(Tag *this,State *start,string *type)

{
  bool bVar1;
  ostream *poVar2;
  Belief *local_28;
  Belief *prior;
  string *type_local;
  State *start_local;
  Tag *this_local;
  
  bVar1 = std::operator==(type,"EXACT");
  if (bVar1) {
    local_28 = ExactPrior(this);
  }
  else {
    bVar1 = std::operator==(type,"DEFAULT");
    if (!bVar1) {
      bVar1 = std::operator==(type,"PARTICLE");
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "[Tag::InitialBelief] Unsupported belief type: ");
        poVar2 = std::operator<<(poVar2,(string *)type);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        exit(0);
      }
    }
    local_28 = ApproxPrior(this);
  }
  return local_28;
}

Assistant:

Belief* Tag::InitialBelief(const State* start, string type) const {
	Belief* prior = NULL;
	if (type == "EXACT") {
		prior = ExactPrior();
	} else if (type == "DEFAULT" || type == "PARTICLE") {
		prior = ApproxPrior();
	} else {
		cerr << "[Tag::InitialBelief] Unsupported belief type: " << type << endl;
		exit(0);
	}

	return prior;
}